

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  sqlite3 *psVar1;
  Expr *pEVar2;
  uint uVar3;
  Expr *in_RCX;
  uint *in_RDX;
  ExprList *in_RSI;
  Parse *in_RDI;
  Expr *pFirst;
  Expr *pSubExpr;
  int iFirst;
  int i;
  int n;
  sqlite3 *db;
  Expr *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  int iVar4;
  Parse *in_stack_ffffffffffffffb8;
  Expr *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int local_30;
  ExprList *local_10;
  
  psVar1 = in_RDI->db;
  if (in_RSI == (ExprList *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = in_RSI->nExpr;
  }
  local_10 = in_RSI;
  if ((in_RDX != (uint *)0x0) && (in_RCX != (Expr *)0x0)) {
    iVar5 = iVar4;
    if (in_RCX->op != 0x8b) {
      in_stack_ffffffffffffffb0 = *in_RDX;
      uVar3 = sqlite3ExprVectorSize(in_RCX);
      if (in_stack_ffffffffffffffb0 != uVar3) {
        sqlite3ErrorMsg(in_RDI,"%d columns assigned %d values",(ulong)*in_RDX,(ulong)uVar3);
        goto LAB_001bab08;
      }
    }
    for (local_30 = 0; local_30 < (int)*in_RDX; local_30 = local_30 + 1) {
      in_stack_ffffffffffffffc0 =
           sqlite3ExprForVectorField
                     ((Parse *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
                      (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8
                     );
      if ((in_stack_ffffffffffffffc0 != (Expr *)0x0) &&
         (local_10 = sqlite3ExprListAppend
                               (in_stack_ffffffffffffffb8,
                                (ExprList *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8), local_10 != (ExprList *)0x0)) {
        local_10->a[local_10->nExpr + -1].zEName = *(char **)(in_RDX + (long)local_30 * 2 + 2);
        (in_RDX + (long)local_30 * 2 + 2)[0] = 0;
        (in_RDX + (long)local_30 * 2 + 2)[1] = 0;
      }
    }
    if (((psVar1->mallocFailed == '\0') && (in_RCX->op == 0x8b)) && (local_10 != (ExprList *)0x0)) {
      pEVar2 = local_10->a[iVar5].pExpr;
      pEVar2->pRight = in_RCX;
      pEVar2->iTable = *in_RDX;
    }
  }
LAB_001bab08:
  sqlite3ExprUnmapAndDelete
            ((Parse *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
  sqlite3IdListDelete((sqlite3 *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                      (IdList *)in_stack_ffffffffffffffa8);
  return local_10;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT,
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i, pColumns->nId);
    assert( pSubExpr!=0 || db->mallocFailed );
    if( pSubExpr==0 ) continue;
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zEName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );

    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  sqlite3ExprUnmapAndDelete(pParse, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}